

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElectromagneticEmissionBeamData.cpp
# Opt level: O0

void __thiscall
DIS::ElectromagneticEmissionBeamData::marshal
          (ElectromagneticEmissionBeamData *this,DataStream *dataStream)

{
  undefined8 uVar1;
  size_type sVar2;
  const_reference pvVar3;
  undefined1 local_50 [8];
  TrackJamData x;
  size_t idx;
  DataStream *dataStream_local;
  ElectromagneticEmissionBeamData *this_local;
  
  DataStream::operator<<(dataStream,this->_beamDataLength);
  DataStream::operator<<(dataStream,this->_beamIDNumber);
  DataStream::operator<<(dataStream,this->_beamParameterIndex);
  EEFundamentalParameterData::marshal(&this->_fundamentalParameterData,dataStream);
  BeamData::marshal(&this->_beamData,dataStream);
  DataStream::operator<<(dataStream,this->_beamFunction);
  sVar2 = std::vector<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>::size
                    (&this->_trackJamTargets);
  DataStream::operator<<(dataStream,(uchar)sVar2);
  DataStream::operator<<(dataStream,this->_highDensityTrackJam);
  DataStream::operator<<(dataStream,this->_beamStatus);
  JammingTechnique::marshal(&this->_jammingTechnique,dataStream);
  x._emitterNumber = '\0';
  x._beamNumber = '\0';
  x._42_6_ = 0;
  while( true ) {
    uVar1 = x._40_8_;
    sVar2 = std::vector<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>::size
                      (&this->_trackJamTargets);
    if (sVar2 <= (ulong)uVar1) break;
    pvVar3 = std::vector<DIS::TrackJamData,_std::allocator<DIS::TrackJamData>_>::operator[]
                       (&this->_trackJamTargets,x._40_8_);
    TrackJamData::TrackJamData((TrackJamData *)local_50,pvVar3);
    TrackJamData::marshal((TrackJamData *)local_50,dataStream);
    TrackJamData::~TrackJamData((TrackJamData *)local_50);
    x._40_8_ = x._40_8_ + 1;
  }
  return;
}

Assistant:

void ElectromagneticEmissionBeamData::marshal(DataStream& dataStream) const
{
    dataStream << _beamDataLength;
    dataStream << _beamIDNumber;
    dataStream << _beamParameterIndex;
    _fundamentalParameterData.marshal(dataStream);
	_beamData.marshal(dataStream);
    dataStream << _beamFunction;
    dataStream << ( unsigned char )_trackJamTargets.size();
    dataStream << _highDensityTrackJam;
    dataStream << _beamStatus;
    _jammingTechnique.marshal(dataStream);

     for(size_t idx = 0; idx < _trackJamTargets.size(); idx++)
     {
        TrackJamData x = _trackJamTargets[idx];
        x.marshal(dataStream);
     }

}